

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::IsMousePosValid(ImVec2 *mouse_pos)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ImVec2 *pIVar3;
  
  pIVar3 = &(GImGui->IO).MousePos;
  if (mouse_pos != (ImVec2 *)0x0) {
    pIVar3 = mouse_pos;
  }
  uVar1 = vcmpps_avx512vl(SUB6416(ZEXT464(0xc87a0000),0),ZEXT416((uint)pIVar3->x),2);
  uVar2 = vcmpps_avx512vl(SUB6416(ZEXT464(0xc87a0000),0),ZEXT416((uint)pIVar3->y),2);
  return (bool)((byte)uVar1 & (byte)uVar2 & 1);
}

Assistant:

bool ImGui::IsMousePosValid(const ImVec2* mouse_pos)
{
    // The assert is only to silence a false-positive in XCode Static Analysis.
    // Because GImGui is not dereferenced in every code path, the static analyzer assume that it may be NULL (which it doesn't for other functions).
    IM_ASSERT(GImGui != NULL);
    const float MOUSE_INVALID = -256000.0f;
    ImVec2 p = mouse_pos ? *mouse_pos : GImGui->IO.MousePos;
    return p.x >= MOUSE_INVALID && p.y >= MOUSE_INVALID;
}